

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_feature_filter.cpp
# Opt level: O0

void * Fossilize::build_pnext_chain
                 (VulkanProperties *props,uint32_t api_version,char **enabled_extensions,
                 uint32_t extension_count)

{
  char *pcVar1;
  size_type sVar2;
  bool bVar3;
  pair<std::__detail::_Node_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_true>,_bool>
  pVar4;
  allocator local_9d1;
  key_type local_9d0;
  undefined1 local_9ab;
  byte local_9aa;
  bool supports_extension_17;
  bool is_minimum_api_version_17;
  allocator local_981;
  key_type local_980;
  undefined1 local_95b;
  byte local_95a;
  bool supports_extension_16;
  bool is_minimum_api_version_16;
  allocator local_931;
  key_type local_930;
  undefined1 local_90b;
  byte local_90a;
  bool supports_extension_15;
  bool is_minimum_api_version_15;
  allocator local_8e1;
  key_type local_8e0;
  undefined1 local_8bb;
  byte local_8ba;
  bool supports_extension_14;
  bool is_minimum_api_version_14;
  allocator local_891;
  key_type local_890;
  undefined1 local_86b;
  byte local_86a;
  bool supports_extension_13;
  bool is_minimum_api_version_13;
  allocator local_841;
  key_type local_840;
  undefined1 local_81b;
  byte local_81a;
  bool supports_extension_12;
  bool is_minimum_api_version_12;
  allocator local_7f1;
  key_type local_7f0;
  undefined1 local_7cb;
  byte local_7ca;
  allocator local_7c9;
  undefined1 local_7c8 [5];
  bool supports_extension_11;
  bool is_minimum_api_version_11;
  allocator local_7a1;
  key_type local_7a0;
  byte local_77b;
  byte local_77a;
  bool supports_extension_10;
  bool is_minimum_api_version_10;
  allocator local_751;
  key_type local_750;
  undefined1 local_72b;
  byte local_72a;
  bool supports_extension_9;
  bool is_minimum_api_version_9;
  allocator local_701;
  key_type local_700;
  undefined1 local_6db;
  byte local_6da;
  bool supports_extension_8;
  bool is_minimum_api_version_8;
  allocator local_6b1;
  key_type local_6b0;
  undefined1 local_68b;
  byte local_68a;
  bool supports_extension_7;
  bool is_minimum_api_version_7;
  allocator local_661;
  key_type local_660;
  undefined1 local_63b;
  byte local_63a;
  bool supports_extension_6;
  bool is_minimum_api_version_6;
  allocator local_611;
  key_type local_610;
  undefined1 local_5eb;
  byte local_5ea;
  bool supports_extension_5;
  bool is_minimum_api_version_5;
  allocator local_5c1;
  key_type local_5c0;
  undefined1 local_59b;
  byte local_59a;
  bool supports_extension_4;
  bool is_minimum_api_version_4;
  allocator local_571;
  key_type local_570;
  undefined1 local_54b;
  byte local_54a;
  bool supports_extension_3;
  bool is_minimum_api_version_3;
  allocator local_521;
  key_type local_520;
  undefined1 local_4fb;
  byte local_4fa;
  bool supports_extension_2;
  bool is_minimum_api_version_2;
  undefined1 local_4d3;
  undefined1 local_4d2;
  bool supports_extension_1;
  bool is_minimum_api_version_1;
  allocator local_4a9;
  key_type local_4a8;
  undefined1 local_482;
  byte local_481;
  bool supports_extension;
  _Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  _Stack_480;
  bool is_minimum_api_version;
  undefined1 local_478;
  allocator local_469;
  value_type local_468;
  uint local_444;
  undefined1 local_440 [4];
  uint32_t i;
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  enabled_extension_set;
  void **ppNext;
  void *pNext;
  uint32_t local_24;
  char **ppcStack_20;
  uint32_t extension_count_local;
  char **enabled_extensions_local;
  VulkanProperties *pVStack_10;
  uint32_t api_version_local;
  VulkanProperties *props_local;
  
  local_24 = extension_count;
  ppcStack_20 = enabled_extensions;
  enabled_extensions_local._4_4_ = api_version;
  pVStack_10 = props;
  memset(&pNext,0,0x3d0);
  memcpy(pVStack_10,&pNext,0x3d0);
  ppNext = (void **)0x0;
  enabled_extension_set._M_h._M_single_bucket = (__node_base_ptr)0x0;
  std::
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::unordered_set((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_440);
  for (local_444 = 0; local_444 < local_24; local_444 = local_444 + 1) {
    pcVar1 = ppcStack_20[local_444];
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_468,pcVar1,&local_469);
    pVar4 = std::
            unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::insert((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_440,&local_468);
    _Stack_480._M_cur =
         (__node_type *)
         pVar4.first.
         super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
         ._M_cur;
    local_478 = pVar4.second;
    std::__cxx11::string::~string((string *)&local_468);
    std::allocator<char>::~allocator((allocator<char> *)&local_469);
  }
  local_481 = 0x3fffff < enabled_extensions_local._4_4_;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_4a8,"VK_EXT_descriptor_indexing",&local_4a9);
  sVar2 = std::
          unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::count((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_440,&local_4a8);
  std::__cxx11::string::~string((string *)&local_4a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_4a9);
  if ((sVar2 != 0) && ((local_481 & 1) != 0)) {
    (pVStack_10->descriptor_indexing).sType =
         VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_DESCRIPTOR_INDEXING_PROPERTIES;
    ppNext = (void **)pVStack_10;
    if (enabled_extension_set._M_h._M_single_bucket != (__node_base_ptr)0x0) {
      (enabled_extension_set._M_h._M_single_bucket)->_M_nxt = (_Hash_node_base *)pVStack_10;
    }
    enabled_extension_set._M_h._M_single_bucket =
         (__node_base_ptr)&(pVStack_10->descriptor_indexing).pNext;
  }
  local_4d2 = 0x400fff < enabled_extensions_local._4_4_;
  local_4d3 = 1;
  if ((bool)local_4d2) {
    (pVStack_10->subgroup).sType = VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_SUBGROUP_PROPERTIES;
    if (ppNext == (void **)0x0) {
      ppNext = (void **)&pVStack_10->subgroup;
    }
    if (enabled_extension_set._M_h._M_single_bucket != (__node_base_ptr)0x0) {
      (enabled_extension_set._M_h._M_single_bucket)->_M_nxt =
           (_Hash_node_base *)&pVStack_10->subgroup;
    }
    enabled_extension_set._M_h._M_single_bucket = (__node_base_ptr)&(pVStack_10->subgroup).pNext;
  }
  local_4fa = 0x3fffff < enabled_extensions_local._4_4_;
  local_482 = sVar2 != 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_520,"VK_KHR_shader_float_controls",&local_521);
  sVar2 = std::
          unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::count((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_440,&local_520);
  std::__cxx11::string::~string((string *)&local_520);
  std::allocator<char>::~allocator((allocator<char> *)&local_521);
  if ((sVar2 != 0) && ((local_4fa & 1) != 0)) {
    (pVStack_10->float_control).sType = VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_FLOAT_CONTROLS_PROPERTIES;
    if (ppNext == (void **)0x0) {
      ppNext = (void **)&pVStack_10->float_control;
    }
    if (enabled_extension_set._M_h._M_single_bucket != (__node_base_ptr)0x0) {
      (enabled_extension_set._M_h._M_single_bucket)->_M_nxt =
           (_Hash_node_base *)&pVStack_10->float_control;
    }
    enabled_extension_set._M_h._M_single_bucket =
         (__node_base_ptr)&(pVStack_10->float_control).pNext;
  }
  local_54a = 0x3fffff < enabled_extensions_local._4_4_;
  local_4fb = sVar2 != 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_570,"VK_KHR_depth_stencil_resolve",&local_571);
  sVar2 = std::
          unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::count((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_440,&local_570);
  std::__cxx11::string::~string((string *)&local_570);
  std::allocator<char>::~allocator((allocator<char> *)&local_571);
  if ((sVar2 != 0) && ((local_54a & 1) != 0)) {
    (pVStack_10->ds_resolve).sType =
         VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_DEPTH_STENCIL_RESOLVE_PROPERTIES;
    if (ppNext == (void **)0x0) {
      ppNext = (void **)&pVStack_10->ds_resolve;
    }
    if (enabled_extension_set._M_h._M_single_bucket != (__node_base_ptr)0x0) {
      (enabled_extension_set._M_h._M_single_bucket)->_M_nxt =
           (_Hash_node_base *)&pVStack_10->ds_resolve;
    }
    enabled_extension_set._M_h._M_single_bucket = (__node_base_ptr)&(pVStack_10->ds_resolve).pNext;
  }
  local_59a = 0x3fffff < enabled_extensions_local._4_4_;
  local_54b = sVar2 != 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_5c0,"VK_KHR_multiview",&local_5c1);
  sVar2 = std::
          unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::count((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_440,&local_5c0);
  std::__cxx11::string::~string((string *)&local_5c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_5c1);
  if ((sVar2 != 0) && ((local_59a & 1) != 0)) {
    (pVStack_10->multiview).sType = VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_MULTIVIEW_PROPERTIES;
    if (ppNext == (void **)0x0) {
      ppNext = (void **)&pVStack_10->multiview;
    }
    if (enabled_extension_set._M_h._M_single_bucket != (__node_base_ptr)0x0) {
      (enabled_extension_set._M_h._M_single_bucket)->_M_nxt =
           (_Hash_node_base *)&pVStack_10->multiview;
    }
    enabled_extension_set._M_h._M_single_bucket = (__node_base_ptr)&(pVStack_10->multiview).pNext;
  }
  local_5ea = 0x3fffff < enabled_extensions_local._4_4_;
  local_59b = sVar2 != 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_610,"VK_KHR_fragment_shading_rate",&local_611);
  sVar2 = std::
          unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::count((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_440,&local_610);
  std::__cxx11::string::~string((string *)&local_610);
  std::allocator<char>::~allocator((allocator<char> *)&local_611);
  if ((sVar2 != 0) && ((local_5ea & 1) != 0)) {
    (pVStack_10->fragment_shading_rate).sType =
         VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_FRAGMENT_SHADING_RATE_PROPERTIES_KHR;
    if (ppNext == (void **)0x0) {
      ppNext = (void **)&pVStack_10->fragment_shading_rate;
    }
    if (enabled_extension_set._M_h._M_single_bucket != (__node_base_ptr)0x0) {
      (enabled_extension_set._M_h._M_single_bucket)->_M_nxt =
           (_Hash_node_base *)&pVStack_10->fragment_shading_rate;
    }
    enabled_extension_set._M_h._M_single_bucket =
         (__node_base_ptr)&(pVStack_10->fragment_shading_rate).pNext;
  }
  local_63a = 0x3fffff < enabled_extensions_local._4_4_;
  local_5eb = sVar2 != 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_660,"VK_KHR_ray_tracing_pipeline",&local_661);
  sVar2 = std::
          unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::count((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_440,&local_660);
  std::__cxx11::string::~string((string *)&local_660);
  std::allocator<char>::~allocator((allocator<char> *)&local_661);
  if ((sVar2 != 0) && ((local_63a & 1) != 0)) {
    (pVStack_10->ray_tracing_pipeline).sType =
         VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_RAY_TRACING_PIPELINE_PROPERTIES_KHR;
    if (ppNext == (void **)0x0) {
      ppNext = (void **)&pVStack_10->ray_tracing_pipeline;
    }
    if (enabled_extension_set._M_h._M_single_bucket != (__node_base_ptr)0x0) {
      (enabled_extension_set._M_h._M_single_bucket)->_M_nxt =
           (_Hash_node_base *)&pVStack_10->ray_tracing_pipeline;
    }
    enabled_extension_set._M_h._M_single_bucket =
         (__node_base_ptr)&(pVStack_10->ray_tracing_pipeline).pNext;
  }
  local_68a = 0x3fffff < enabled_extensions_local._4_4_;
  local_63b = sVar2 != 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_6b0,"VK_KHR_acceleration_structure",&local_6b1);
  sVar2 = std::
          unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::count((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_440,&local_6b0);
  std::__cxx11::string::~string((string *)&local_6b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_6b1);
  if ((sVar2 != 0) && ((local_68a & 1) != 0)) {
    (pVStack_10->acceleration_structure).sType =
         VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_ACCELERATION_STRUCTURE_PROPERTIES_KHR;
    if (ppNext == (void **)0x0) {
      ppNext = (void **)&pVStack_10->acceleration_structure;
    }
    if (enabled_extension_set._M_h._M_single_bucket != (__node_base_ptr)0x0) {
      (enabled_extension_set._M_h._M_single_bucket)->_M_nxt =
           (_Hash_node_base *)&pVStack_10->acceleration_structure;
    }
    enabled_extension_set._M_h._M_single_bucket =
         (__node_base_ptr)&(pVStack_10->acceleration_structure).pNext;
  }
  local_6da = 0x3fffff < enabled_extensions_local._4_4_;
  local_68b = sVar2 != 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_700,"VK_EXT_subgroup_size_control",&local_701);
  sVar2 = std::
          unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::count((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_440,&local_700);
  std::__cxx11::string::~string((string *)&local_700);
  std::allocator<char>::~allocator((allocator<char> *)&local_701);
  if ((sVar2 != 0) && ((local_6da & 1) != 0)) {
    (pVStack_10->subgroup_size_control).sType =
         VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_SUBGROUP_SIZE_CONTROL_PROPERTIES;
    if (ppNext == (void **)0x0) {
      ppNext = (void **)&pVStack_10->subgroup_size_control;
    }
    if (enabled_extension_set._M_h._M_single_bucket != (__node_base_ptr)0x0) {
      (enabled_extension_set._M_h._M_single_bucket)->_M_nxt =
           (_Hash_node_base *)&pVStack_10->subgroup_size_control;
    }
    enabled_extension_set._M_h._M_single_bucket =
         (__node_base_ptr)&(pVStack_10->subgroup_size_control).pNext;
  }
  local_72a = 0x3fffff < enabled_extensions_local._4_4_;
  local_6db = sVar2 != 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_750,"VK_EXT_inline_uniform_block",&local_751);
  sVar2 = std::
          unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::count((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_440,&local_750);
  std::__cxx11::string::~string((string *)&local_750);
  std::allocator<char>::~allocator((allocator<char> *)&local_751);
  if ((sVar2 != 0) && ((local_72a & 1) != 0)) {
    (pVStack_10->inline_uniform_block).sType =
         VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_INLINE_UNIFORM_BLOCK_PROPERTIES;
    if (ppNext == (void **)0x0) {
      ppNext = (void **)&pVStack_10->inline_uniform_block;
    }
    if (enabled_extension_set._M_h._M_single_bucket != (__node_base_ptr)0x0) {
      (enabled_extension_set._M_h._M_single_bucket)->_M_nxt =
           (_Hash_node_base *)&pVStack_10->inline_uniform_block;
    }
    enabled_extension_set._M_h._M_single_bucket =
         (__node_base_ptr)&(pVStack_10->inline_uniform_block).pNext;
  }
  local_77a = 0x3fffff < enabled_extensions_local._4_4_;
  local_72b = sVar2 != 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_7a0,"VK_KHR_vertex_attribute_divisor",&local_7a1);
  sVar2 = std::
          unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::count((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_440,&local_7a0);
  bVar3 = sVar2 != 0;
  std::__cxx11::string::~string((string *)&local_7a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_7a1);
  local_77b = bVar3;
  if (!bVar3) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)local_7c8,"VK_KHR_vertex_attribute_divisor",&local_7c9);
    sVar2 = std::
            unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::count((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_440,(key_type *)local_7c8);
    local_77b = sVar2 != 0;
    std::__cxx11::string::~string((string *)local_7c8);
    std::allocator<char>::~allocator((allocator<char> *)&local_7c9);
  }
  if (((local_77b & 1) != 0) && ((local_77a & 1) != 0)) {
    (pVStack_10->attribute_divisor).sType =
         VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_VERTEX_ATTRIBUTE_DIVISOR_PROPERTIES;
    if (ppNext == (void **)0x0) {
      ppNext = (void **)&pVStack_10->attribute_divisor;
    }
    if (enabled_extension_set._M_h._M_single_bucket != (__node_base_ptr)0x0) {
      (enabled_extension_set._M_h._M_single_bucket)->_M_nxt =
           (_Hash_node_base *)&pVStack_10->attribute_divisor;
    }
    enabled_extension_set._M_h._M_single_bucket =
         (__node_base_ptr)&(pVStack_10->attribute_divisor).pNext;
  }
  local_7ca = 0x3fffff < enabled_extensions_local._4_4_;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_7f0,"VK_KHR_push_descriptor",&local_7f1);
  sVar2 = std::
          unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::count((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_440,&local_7f0);
  std::__cxx11::string::~string((string *)&local_7f0);
  std::allocator<char>::~allocator((allocator<char> *)&local_7f1);
  if ((sVar2 != 0) && ((local_7ca & 1) != 0)) {
    (pVStack_10->push_descriptor).sType =
         VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_PUSH_DESCRIPTOR_PROPERTIES;
    if (ppNext == (void **)0x0) {
      ppNext = (void **)&pVStack_10->push_descriptor;
    }
    if (enabled_extension_set._M_h._M_single_bucket != (__node_base_ptr)0x0) {
      (enabled_extension_set._M_h._M_single_bucket)->_M_nxt =
           (_Hash_node_base *)&pVStack_10->push_descriptor;
    }
    enabled_extension_set._M_h._M_single_bucket =
         (__node_base_ptr)&(pVStack_10->push_descriptor).pNext;
  }
  local_81a = 0x3fffff < enabled_extensions_local._4_4_;
  local_7cb = sVar2 != 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_840,"VK_EXT_sample_locations",&local_841);
  sVar2 = std::
          unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::count((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_440,&local_840);
  std::__cxx11::string::~string((string *)&local_840);
  std::allocator<char>::~allocator((allocator<char> *)&local_841);
  if ((sVar2 != 0) && ((local_81a & 1) != 0)) {
    (pVStack_10->sample_locations).sType =
         VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_SAMPLE_LOCATIONS_PROPERTIES_EXT;
    if (ppNext == (void **)0x0) {
      ppNext = (void **)&pVStack_10->sample_locations;
    }
    if (enabled_extension_set._M_h._M_single_bucket != (__node_base_ptr)0x0) {
      (enabled_extension_set._M_h._M_single_bucket)->_M_nxt =
           (_Hash_node_base *)&pVStack_10->sample_locations;
    }
    enabled_extension_set._M_h._M_single_bucket =
         (__node_base_ptr)&(pVStack_10->sample_locations).pNext;
  }
  local_86a = 0x3fffff < enabled_extensions_local._4_4_;
  local_81b = sVar2 != 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_890,"VK_EXT_extended_dynamic_state3",&local_891);
  sVar2 = std::
          unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::count((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_440,&local_890);
  std::__cxx11::string::~string((string *)&local_890);
  std::allocator<char>::~allocator((allocator<char> *)&local_891);
  if ((sVar2 != 0) && ((local_86a & 1) != 0)) {
    (pVStack_10->extended_dynamic_state3).sType =
         VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_EXTENDED_DYNAMIC_STATE_3_PROPERTIES_EXT;
    if (ppNext == (void **)0x0) {
      ppNext = (void **)&pVStack_10->extended_dynamic_state3;
    }
    if (enabled_extension_set._M_h._M_single_bucket != (__node_base_ptr)0x0) {
      (enabled_extension_set._M_h._M_single_bucket)->_M_nxt =
           (_Hash_node_base *)&pVStack_10->extended_dynamic_state3;
    }
    enabled_extension_set._M_h._M_single_bucket =
         (__node_base_ptr)&(pVStack_10->extended_dynamic_state3).pNext;
  }
  local_8ba = 0x3fffff < enabled_extensions_local._4_4_;
  local_86b = sVar2 != 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_8e0,"VK_EXT_mesh_shader",&local_8e1);
  sVar2 = std::
          unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::count((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_440,&local_8e0);
  std::__cxx11::string::~string((string *)&local_8e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_8e1);
  if ((sVar2 != 0) && ((local_8ba & 1) != 0)) {
    (pVStack_10->mesh_shader).sType = VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_MESH_SHADER_PROPERTIES_EXT;
    if (ppNext == (void **)0x0) {
      ppNext = (void **)&pVStack_10->mesh_shader;
    }
    if (enabled_extension_set._M_h._M_single_bucket != (__node_base_ptr)0x0) {
      (enabled_extension_set._M_h._M_single_bucket)->_M_nxt =
           (_Hash_node_base *)&pVStack_10->mesh_shader;
    }
    enabled_extension_set._M_h._M_single_bucket = (__node_base_ptr)&(pVStack_10->mesh_shader).pNext;
  }
  local_90a = 0x3fffff < enabled_extensions_local._4_4_;
  local_8bb = sVar2 != 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_930,"VK_EXT_shader_module_identifier",&local_931);
  sVar2 = std::
          unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::count((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_440,&local_930);
  std::__cxx11::string::~string((string *)&local_930);
  std::allocator<char>::~allocator((allocator<char> *)&local_931);
  if ((sVar2 != 0) && ((local_90a & 1) != 0)) {
    (pVStack_10->shader_module_identifier).sType =
         VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_SHADER_MODULE_IDENTIFIER_PROPERTIES_EXT;
    if (ppNext == (void **)0x0) {
      ppNext = (void **)&pVStack_10->shader_module_identifier;
    }
    if (enabled_extension_set._M_h._M_single_bucket != (__node_base_ptr)0x0) {
      (enabled_extension_set._M_h._M_single_bucket)->_M_nxt =
           (_Hash_node_base *)&pVStack_10->shader_module_identifier;
    }
    enabled_extension_set._M_h._M_single_bucket =
         (__node_base_ptr)&(pVStack_10->shader_module_identifier).pNext;
  }
  local_95a = 0x3fffff < enabled_extensions_local._4_4_;
  local_90b = sVar2 != 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_980,"VK_EXT_blend_operation_advanced",&local_981);
  sVar2 = std::
          unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::count((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_440,&local_980);
  std::__cxx11::string::~string((string *)&local_980);
  std::allocator<char>::~allocator((allocator<char> *)&local_981);
  if ((sVar2 != 0) && ((local_95a & 1) != 0)) {
    (pVStack_10->blend_operation_advanced).sType =
         VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_BLEND_OPERATION_ADVANCED_PROPERTIES_EXT;
    if (ppNext == (void **)0x0) {
      ppNext = (void **)&pVStack_10->blend_operation_advanced;
    }
    if (enabled_extension_set._M_h._M_single_bucket != (__node_base_ptr)0x0) {
      (enabled_extension_set._M_h._M_single_bucket)->_M_nxt =
           (_Hash_node_base *)&pVStack_10->blend_operation_advanced;
    }
    enabled_extension_set._M_h._M_single_bucket =
         (__node_base_ptr)&(pVStack_10->blend_operation_advanced).pNext;
  }
  local_9aa = 0x3fffff < enabled_extensions_local._4_4_;
  local_95b = sVar2 != 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_9d0,"VK_KHR_maintenance7",&local_9d1);
  sVar2 = std::
          unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::count((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_440,&local_9d0);
  std::__cxx11::string::~string((string *)&local_9d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_9d1);
  if ((sVar2 != 0) && ((local_9aa & 1) != 0)) {
    (pVStack_10->maintenance7).sType =
         VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_MAINTENANCE_7_PROPERTIES_KHR;
    if (ppNext == (void **)0x0) {
      ppNext = (void **)&pVStack_10->maintenance7;
    }
    if (enabled_extension_set._M_h._M_single_bucket != (__node_base_ptr)0x0) {
      (enabled_extension_set._M_h._M_single_bucket)->_M_nxt =
           (_Hash_node_base *)&pVStack_10->maintenance7;
    }
    enabled_extension_set._M_h._M_single_bucket = (__node_base_ptr)&(pVStack_10->maintenance7).pNext
    ;
  }
  local_9ab = sVar2 != 0;
  std::
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unordered_set((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_440);
  return ppNext;
}

Assistant:

void *build_pnext_chain(VulkanProperties &props, uint32_t api_version,
                        const char **enabled_extensions, uint32_t extension_count)
{
	props = {};
	void *pNext = nullptr;
	void **ppNext = nullptr;

	std::unordered_set<std::string> enabled_extension_set;
	for (uint32_t i = 0; i < extension_count; i++)
		enabled_extension_set.insert(enabled_extensions[i]);

#define CHAIN(struct_type, member, min_api_version, required_extension, required_extension_alias) \
	do { \
		bool is_minimum_api_version = api_version >= min_api_version; \
		bool supports_extension = required_extension == nullptr || enabled_extension_set.count(required_extension) != 0; \
		if (!supports_extension && required_extension_alias) \
			supports_extension = enabled_extension_set.count(required_extension_alias) != 0; \
		if (supports_extension && is_minimum_api_version) { \
			member.sType = struct_type; \
			if (!pNext) pNext = &member; \
			if (ppNext) *ppNext = &member; \
			ppNext = &member.pNext; \
		} \
	} while (0)

#define P(struct_type, member, minimum_api_version, required_extension) \
	CHAIN(VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_##struct_type##_PROPERTIES, props.member, \
	VK_API_VERSION_##minimum_api_version, VK_##required_extension##_EXTENSION_NAME, nullptr)
#define P_CORE(struct_type, member, minimum_api_version) \
	CHAIN(VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_##struct_type##_PROPERTIES, props.member, \
	VK_API_VERSION_##minimum_api_version, nullptr, nullptr)
#define PE(struct_type, member, ext) \
	CHAIN(VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_##struct_type##_PROPERTIES_##ext, props.member, \
	VK_API_VERSION_1_0, VK_##ext##_##struct_type##_EXTENSION_NAME, nullptr)
#define PE_ALIAS(struct_type, member, ext, ext_alias) \
	CHAIN(VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_##struct_type##_PROPERTIES_##ext, props.member, \
	VK_API_VERSION_1_0, VK_##ext##_##struct_type##_EXTENSION_NAME, VK_##ext##_##struct_type##_EXTENSION_NAME)

#include "fossilize_feature_filter_properties.inc"

#undef CHAIN
#undef P
#undef P_CORE
#undef PE
#undef PE_ALIAS

	return pNext;
}